

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O2

bool __thiscall
chaiscript::Type_Conversions::
convertable_type<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>const&>
          (Type_Conversions *this)

{
  set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *this_00;
  size_type sVar1;
  type_info *type;
  key_type local_8;
  
  local_8 = (key_type)
            &bootstrap::standard_library::
             Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
             ::typeinfo;
  this_00 = thread_cache(this);
  sVar1 = std::
          set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
          ::count(this_00,&local_8);
  return sVar1 != 0;
}

Assistant:

bool convertable_type() const noexcept {
      const auto type = user_type<T>().bare_type_info();
      return thread_cache().count(type) != 0;
    }